

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::setState
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,DataFlowState *newState)

{
  char *__s;
  DataFlowState *ctx;
  DataFlowState *ctx_00;
  DataFlowState local_b8;
  
  ctx = &local_b8;
  ctx_00 = &local_b8;
  this->isStateSplit = false;
  DataFlowState::operator=(&this->state,newState);
  __s = local_b8.assigned.
        super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.firstElement;
  memset(__s,0,0x88);
  local_b8.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
  len = 0;
  local_b8.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
  cap = 2;
  local_b8.reachable = true;
  local_b8.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
  data_ = (pointer)__s;
  DataFlowState::operator=(&this->stateWhenTrue,&local_b8);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_b8,
             (EVP_PKEY_CTX *)ctx);
  memset(__s,0,0x88);
  local_b8.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
  len = 0;
  local_b8.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
  cap = 2;
  local_b8.reachable = true;
  local_b8.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
  data_ = (pointer)__s;
  DataFlowState::operator=(&this->stateWhenFalse,&local_b8);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_b8,
             (EVP_PKEY_CTX *)ctx_00);
  return;
}

Assistant:

void setState(TState newState) {
        isStateSplit = false;
        state = std::move(newState);
        stateWhenTrue = {};
        stateWhenFalse = {};
    }